

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

Rotation * iDynTree::Rotation::RotationFromQuaternion(Vector4 *_quaternion)

{
  Rotation *in_RDI;
  Rotation *_rotation;
  Vector4 *in_stack_00000108;
  Rotation *in_stack_00000110;
  
  Rotation((Rotation *)0x6c8f70);
  fromQuaternion(in_stack_00000110,in_stack_00000108);
  return in_RDI;
}

Assistant:

Rotation Rotation::RotationFromQuaternion(const iDynTree::Vector4& _quaternion)
    {
        //Taken from "Contributions au contrôle automatique de véhicules aériens"
        //PhD thesis of "Minh Duc HUA"
        //INRIA Sophia Antipolis
        //Equation 3.8 (page 101)

        // Rodriques' formula
        // R = I3 + 2s S(r) + 2S(r)^2,
        Rotation _rotation;
        _rotation.fromQuaternion(_quaternion);
        return _rotation;
    }